

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O3

void __thiscall HttpReqThread::~HttpReqThread(HttpReqThread *this)

{
  OS_Counter *pOVar1;
  OS_HttpPayload *this_00;
  TadsMessageQueue *pTVar2;
  
  (this->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__HttpReqThread_0034acd0;
  (this->super_OS_Thread).super_OS_Waitable._vptr_OS_Waitable =
       (_func_int **)&PTR__HttpReqThread_0034ad00;
  lib_free_str(this->host);
  lib_free_str(this->resource);
  lib_free_str(this->verb);
  lib_free_str(this->hdrs);
  this_00 = this->body;
  if (this_00 != (OS_HttpPayload *)0x0) {
    OS_HttpPayload::~OS_HttpPayload(this_00);
    operator_delete(this_00,0x10);
  }
  pTVar2 = this->queue;
  if (pTVar2 != (TadsMessageQueue *)0x0) {
    LOCK();
    pOVar1 = &(pTVar2->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(pTVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
    }
  }
  if (this->idg != (vm_globalvar_t *)0x0) {
    CVmObjTable::delete_global_var(&G_obj_table_X,this->idg);
  }
  OS_Thread::~OS_Thread(&this->super_OS_Thread);
  return;
}

Assistant:

~HttpReqThread()
    {
        /* establish the global context */
        VMGLOB_PTR(vmg);

        /* delete copied strings */
        lib_free_str(host);
        lib_free_str(resource);
        lib_free_str(verb);
        lib_free_str(hdrs);

        /* delete the content body */
        if (body != 0)
            delete body;

        /* release the message queue */
        if (queue != 0)
            queue->release_ref();

        /* delete our ID global, if we still own it */
        if (idg != 0)
            G_obj_table->delete_global_var(idg);

    }